

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.cpp
# Opt level: O0

void __thiscall
duckdb::PrimitiveColumnWriter::FlushPage
          (PrimitiveColumnWriter *this,PrimitiveColumnWriterState *state)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  type pMVar5;
  pointer pCVar6;
  idx_t iVar7;
  undefined8 uVar8;
  long in_RSI;
  long *in_RDI;
  PageHeader *hdr;
  MemoryStream *temp_writer;
  value_type *write_info;
  AllocatedData *in_stack_000001b0;
  data_ptr_t *in_stack_000001b8;
  size_t *in_stack_000001c0;
  MemoryStream *in_stack_000001c8;
  ColumnWriter *in_stack_000001d0;
  pointer in_stack_ffffffffffffff68;
  vector<duckdb::PageWriteInformation,_true> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  InternalException *in_stack_ffffffffffffffb0;
  string local_48 [32];
  reference local_28;
  type local_20;
  reference local_18;
  
  uVar1 = *(ulong *)(in_RSI + 0xc0);
  sVar4 = ::std::vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>
          ::size((vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>
                  *)(in_RSI + 0xa0));
  if (uVar1 <= sVar4) {
    local_18 = vector<duckdb::PageWriteInformation,_true>::operator[]
                         (in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
    pMVar5 = unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::
             operator*((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>
                        *)in_stack_ffffffffffffff70);
    local_28 = local_18;
    local_20 = pMVar5;
    pCVar6 = ::std::
             unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
             ::get((unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
                    *)in_stack_ffffffffffffff70);
    (**(code **)(*in_RDI + 0x68))(in_RDI,pMVar5,pCVar6);
    iVar7 = MemoryStream::GetPosition(local_20);
    iVar3 = NumericLimits<int>::Maximum();
    if ((ulong)(long)iVar3 < iVar7) {
      uVar9 = CONCAT13(1,(int3)in_stack_ffffffffffffffa0);
      uVar8 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_48,"Parquet writer: %d uncompressed page size out of range for type integer",
                 (allocator *)&stack0xffffffffffffffb7);
      MemoryStream::GetPosition(local_20);
      InternalException::InternalException<unsigned_long>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                 CONCAT44(in_stack_ffffffffffffffa4,uVar9));
      __cxa_throw(uVar8,&InternalException::typeinfo,InternalException::~InternalException);
    }
    iVar7 = MemoryStream::GetPosition(local_20);
    iVar3 = UnsafeNumericCast<int,unsigned_long,void>(iVar7);
    (local_28->page_header).uncompressed_page_size = iVar3;
    ColumnWriter::CompressPage
              (in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,
               in_stack_000001b0);
    iVar3 = UnsafeNumericCast<int,unsigned_long,void>(local_18->compressed_size);
    (local_28->page_header).compressed_page_size = iVar3;
    bVar2 = AllocatedData::operator_cast_to_bool(&local_18->compressed_buf);
    if (bVar2) {
      unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::reset
                ((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>
                  *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
  }
  return;
}

Assistant:

void PrimitiveColumnWriter::FlushPage(PrimitiveColumnWriterState &state) {
	D_ASSERT(state.current_page > 0);
	if (state.current_page > state.write_info.size()) {
		return;
	}

	// compress the page info
	auto &write_info = state.write_info[state.current_page - 1];
	auto &temp_writer = *write_info.temp_writer;
	auto &hdr = write_info.page_header;

	FlushPageState(temp_writer, write_info.page_state.get());

	// now that we have finished writing the data we know the uncompressed size
	if (temp_writer.GetPosition() > idx_t(NumericLimits<int32_t>::Maximum())) {
		throw InternalException("Parquet writer: %d uncompressed page size out of range for type integer",
		                        temp_writer.GetPosition());
	}
	hdr.uncompressed_page_size = UnsafeNumericCast<int32_t>(temp_writer.GetPosition());

	// compress the data
	CompressPage(temp_writer, write_info.compressed_size, write_info.compressed_data, write_info.compressed_buf);
	hdr.compressed_page_size = UnsafeNumericCast<int32_t>(write_info.compressed_size);
	D_ASSERT(hdr.uncompressed_page_size > 0);
	D_ASSERT(hdr.compressed_page_size > 0);

	if (write_info.compressed_buf) {
		// if the data has been compressed, we no longer need the uncompressed data
		D_ASSERT(write_info.compressed_buf.get() == write_info.compressed_data);
		write_info.temp_writer.reset();
	}
}